

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

double TasGrid::RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)3>
                 (int max_order,int point,double x,bool *isSupported)

{
  double dVar1;
  undefined8 local_50;
  undefined1 local_42;
  undefined1 local_41;
  double an;
  double xn;
  bool *isSupported_local;
  double x_local;
  int point_local;
  int max_order_local;
  
  dVar1 = scaleX<(TasGrid::RuleLocal::erule)3>(point,x);
  if ((dVar1 < -1.0) || (local_41 = true, 1.0 <= dVar1)) {
    local_42 = false;
    if ((x == 1.0) && (!NAN(x))) {
      local_42 = dVar1 == 1.0;
    }
    local_41 = local_42;
  }
  *isSupported = local_41;
  if ((*isSupported & 1U) == 0) {
    _point_local = 0.0;
  }
  else {
    _point_local = scaleDiffX<(TasGrid::RuleLocal::erule)3>(point);
    if (max_order == 1) {
      if (((x != 1.0) || (NAN(x))) || (point != 0)) {
        local_50 = (double)(~-(ulong)(0.0 <= dVar1) & 0x3ff0000000000000 |
                           (ulong)((uint)(-(ulong)(0.0 <= dVar1) >> 0x20) & 0xbff00000) << 0x20) *
                   _point_local;
      }
      else {
        local_50 = -1.0;
      }
      _point_local = local_50;
    }
    else if (max_order == 2) {
      dVar1 = diffPWQuadratic<(TasGrid::RuleLocal::erule)3>(point,dVar1);
      _point_local = _point_local * dVar1;
    }
    else if (max_order == 3) {
      dVar1 = diffPWCubic<(TasGrid::RuleLocal::erule)3>(point,dVar1);
      _point_local = _point_local * dVar1;
    }
    else {
      dVar1 = diffPWPower<(TasGrid::RuleLocal::erule)3>(max_order,point,dVar1);
      _point_local = _point_local * dVar1;
    }
  }
  return _point_local;
}

Assistant:

double diffSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effrule) {
            case erule::pwc:
                isSupported = false;
                return 0.0;
            case erule::localp: {
                if (point == 0) { isSupported = true; return 0.0; }
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 2) ? an : (((xn >= 0 ? -1.0 : 1.0) * an));
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            case erule::semilocalp:
                switch(point) {
                    case 0: { isSupported = true; return 0.0; }
                    case 1: { isSupported = true; return x - 0.5; }
                    case 2: { isSupported = true; return x + 0.5; }
                    default: {
                        double xn = scaleX<effrule>(point, x);
                        isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                        if (isSupported) {
                            double an = scaleDiffX<effrule>(point);
                            switch(max_order) {
                                case 2: return an * diffPWQuadratic<effrule>(point, xn);
                                case 3: return an * diffPWCubic<effrule>(point, xn);
                                default:
                                    return an * diffPWPower<effrule>(max_order, point, xn);
                            };
                        } else {
                            return 0.0;
                        }
                    }
                };
            case erule::localp0: {
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 0) ? -1.0 : ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            default: { // case erule::localpb:
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
        };
    }